

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_7::Validator::OnAtomicLoadExpr(Validator *this,AtomicLoadExpr *expr)

{
  AtomicLoadExpr *expr_local;
  Validator *this_local;
  
  this->expr_loc_ = (Location *)&expr->field_0x18;
  (anonymous_namespace)::Validator::CheckAtomicExpr<wabt::LoadStoreExpr<(wabt::ExprType)0>>
            ((Validator *)this,expr,0x16c6220);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnAtomicLoadExpr(AtomicLoadExpr* expr) {
  expr_loc_ = &expr->loc;
  CheckAtomicExpr(expr, &TypeChecker::OnAtomicLoad);
  return Result::Ok;
}